

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveQueries.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderPrimitiveQueries::readPrimitiveQueryValues
          (GeometryShaderPrimitiveQueries *this,GLint bufferId,GLuint *nPrimitivesGenerated,
          GLuint *nPrimitivesWritten)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x48))(0x8c8e,0,bufferId);
  (**(code **)(lVar4 + 0x1680))(this->m_po_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error using program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x1ea);
  pcVar1 = *(code **)(lVar4 + 0x30);
  iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
  (*pcVar1)(iVar2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error starting transform feedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x1ed);
  (**(code **)(lVar4 + 0x20))
            ((this->super_TestCaseBase).m_glExtTokens.PRIMITIVES_GENERATED,
             this->m_qo_primitives_generated_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error starting GL_PRIMITIVES_GENERATED_EXT query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x1f1);
  (**(code **)(lVar4 + 0x20))(0x8c88,this->m_qo_tf_primitives_written_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error starting GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,500);
  (**(code **)(lVar4 + 0x538))(0,0,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error executing draw call",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x1f8);
  (**(code **)(lVar4 + 0x638))();
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error finishing transform feedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x1fb);
  (**(code **)(lVar4 + 0x628))((this->super_TestCaseBase).m_glExtTokens.PRIMITIVES_GENERATED);
  (**(code **)(lVar4 + 0x628))(0x8c88);
  (**(code **)(lVar4 + 0xa20))(this->m_qo_primitives_generated_id,0x8866,nPrimitivesGenerated);
  (**(code **)(lVar4 + 0xa20))(this->m_qo_tf_primitives_written_id,0x8866,nPrimitivesWritten);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Error retrieving query values.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x205);
  return;
}

Assistant:

void GeometryShaderPrimitiveQueries::readPrimitiveQueryValues(glw::GLint bufferId, glw::GLuint* nPrimitivesGenerated,
															  glw::GLuint* nPrimitivesWritten)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind the buffer object to hold the captured data.*/
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bufferId);

	/* Activate the program object */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program object");

	gl.beginTransformFeedback(getTFMode());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error starting transform feedback");

	/* Activate the queries */
	gl.beginQuery(m_glExtTokens.PRIMITIVES_GENERATED, m_qo_primitives_generated_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error starting GL_PRIMITIVES_GENERATED_EXT query");

	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, m_qo_tf_primitives_written_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error starting GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query");

	/* Render */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error executing draw call");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error finishing transform feedback");

	/* Query objects end here. */
	gl.endQuery(m_glExtTokens.PRIMITIVES_GENERATED);
	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);

	/* Retrieve query values */
	gl.getQueryObjectuiv(m_qo_primitives_generated_id, GL_QUERY_RESULT, nPrimitivesGenerated);
	gl.getQueryObjectuiv(m_qo_tf_primitives_written_id, GL_QUERY_RESULT, nPrimitivesWritten);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error retrieving query values.");
}